

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

AffineSpace3ff * __thiscall
embree::SceneGraph::TransformNode::get
          (AffineSpace3ff *__return_storage_ptr__,TransformNode *this,float time)

{
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  ulong uVar4;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  uVar4 = (this->spaces).spaces.size_active;
  if (uVar4 < 2) {
    pAVar5 = (this->spaces).spaces.items;
    uVar13 = *(undefined8 *)((long)&(pAVar5->l).vx.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = *(undefined8 *)&(pAVar5->l).vx.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uVar13;
    fVar17 = (pAVar5->l).vy.field_0.m128[0];
    fVar23 = (pAVar5->l).vy.field_0.m128[1];
    fVar24 = (pAVar5->l).vy.field_0.m128[2];
    fVar25 = (pAVar5->l).vy.field_0.m128[3];
    fVar26 = (pAVar5->l).vz.field_0.m128[0];
    fVar27 = (pAVar5->l).vz.field_0.m128[1];
    fVar28 = (pAVar5->l).vz.field_0.m128[2];
    fVar29 = (pAVar5->l).vz.field_0.m128[3];
    fVar19 = (pAVar5->p).field_0.m128[0];
    fVar20 = (pAVar5->p).field_0.m128[1];
    fVar21 = (pAVar5->p).field_0.m128[2];
    fVar22 = (pAVar5->p).field_0.m128[3];
  }
  else {
    fVar16 = (this->spaces).time_range.lower;
    fVar16 = (time - fVar16) / ((this->spaces).time_range.upper - fVar16);
    fVar17 = floorf(fVar16);
    iVar15 = (int)uVar4;
    fVar16 = (float)(iVar15 + -1) * (fVar16 - fVar17);
    fVar17 = floorf(fVar16);
    iVar14 = 0;
    if (0 < (int)fVar17) {
      iVar14 = (int)fVar17;
    }
    iVar15 = iVar15 + -2;
    if (iVar14 < iVar15) {
      iVar15 = iVar14;
    }
    fVar16 = fVar16 - (float)iVar15;
    pAVar6 = (this->spaces).spaces.items;
    fVar18 = 1.0 - fVar16;
    pAVar1 = pAVar6 + (long)iVar15 + 1;
    fVar7 = (pAVar1->l).vx.field_0.m128[1];
    fVar8 = (pAVar1->l).vx.field_0.m128[2];
    fVar9 = (pAVar1->l).vx.field_0.m128[3];
    pAVar5 = pAVar6 + iVar15;
    fVar10 = (pAVar5->l).vx.field_0.m128[1];
    fVar11 = (pAVar5->l).vx.field_0.m128[2];
    fVar12 = (pAVar5->l).vx.field_0.m128[3];
    pVVar2 = &pAVar6[(long)iVar15 + 1].l.vy;
    pVVar3 = &pAVar6[iVar15].l.vy;
    fVar17 = (pVVar3->field_0).m128[0] * fVar18 + (pVVar2->field_0).m128[0] * fVar16;
    fVar23 = (pVVar3->field_0).m128[1] * fVar18 + (pVVar2->field_0).m128[1] * fVar16;
    fVar24 = (pVVar3->field_0).m128[2] * fVar18 + (pVVar2->field_0).m128[2] * fVar16;
    fVar25 = (pVVar3->field_0).m128[3] * fVar18 + (pVVar2->field_0).m128[3] * fVar16;
    pVVar2 = &pAVar6[(long)iVar15 + 1].l.vz;
    pVVar3 = &pAVar6[iVar15].l.vz;
    fVar26 = (pVVar3->field_0).m128[0] * fVar18 + (pVVar2->field_0).m128[0] * fVar16;
    fVar27 = (pVVar3->field_0).m128[1] * fVar18 + (pVVar2->field_0).m128[1] * fVar16;
    fVar28 = (pVVar3->field_0).m128[2] * fVar18 + (pVVar2->field_0).m128[2] * fVar16;
    fVar29 = (pVVar3->field_0).m128[3] * fVar18 + (pVVar2->field_0).m128[3] * fVar16;
    pVVar2 = &pAVar6[(long)iVar15 + 1].p;
    pVVar3 = &pAVar6[iVar15].p;
    fVar19 = fVar18 * (pVVar3->field_0).m128[0] + fVar16 * (pVVar2->field_0).m128[0];
    fVar20 = fVar18 * (pVVar3->field_0).m128[1] + fVar16 * (pVVar2->field_0).m128[1];
    fVar21 = fVar18 * (pVVar3->field_0).m128[2] + fVar16 * (pVVar2->field_0).m128[2];
    fVar22 = fVar18 * (pVVar3->field_0).m128[3] + fVar16 * (pVVar2->field_0).m128[3];
    (__return_storage_ptr__->l).vx.field_0.m128[0] =
         (pAVar5->l).vx.field_0.m128[0] * fVar18 + (pAVar1->l).vx.field_0.m128[0] * fVar16;
    (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar10 * fVar18 + fVar7 * fVar16;
    (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar11 * fVar18 + fVar8 * fVar16;
    (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar12 * fVar18 + fVar9 * fVar16;
  }
  (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar17;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar23;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar24;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar25;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar26;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar27;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar28;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar29;
  (__return_storage_ptr__->p).field_0.m128[0] = fVar19;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar20;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar21;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar22;
  return __return_storage_ptr__;
}

Assistant:

virtual AffineSpace3ff get(float time) const
      {
        if (spaces.size() <= 1) return spaces[0];

        int numTimeSteps = spaces.size();
        
        BBox1f time_range = spaces.time_range;
        time = frac((time-time_range.lower)/time_range.size());
        time = (numTimeSteps-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)numTimeSteps-2);
        float ftime = time - (float)itime;
    
        const AffineSpace3ff xfm0 = spaces[itime+0];
        const AffineSpace3ff xfm1 = spaces[itime+1];
        const AffineSpace3ff xfm  = lerp(xfm0,xfm1,ftime);
        return xfm;
      }